

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O3

void luaD_seterrorobj(lua_State *L,int errcode,StkId oldtop)

{
  StkId pTVar1;
  int iVar2;
  GCObject *pGVar3;
  size_t l;
  TValue *i_o;
  char *str;
  
  if (errcode - 2U < 2) {
    pTVar1 = L->top;
    oldtop->value = pTVar1[-1].value;
    iVar2 = pTVar1[-1].tt;
  }
  else {
    if (errcode == 5) {
      str = "error in error handling";
      l = 0x17;
    }
    else {
      if (errcode != 4) goto LAB_001083c5;
      str = "not enough memory";
      l = 0x11;
    }
    pGVar3 = (GCObject *)luaS_newlstr(L,str,l);
    (oldtop->value).gc = pGVar3;
    iVar2 = 4;
  }
  oldtop->tt = iVar2;
LAB_001083c5:
  L->top = oldtop + 1;
  return;
}

Assistant:

void luaD_seterrorobj (lua_State *L, int errcode, StkId oldtop) {
  switch (errcode) {
    case LUA_ERRMEM: {
      setsvalue2s(L, oldtop, luaS_newliteral(L, MEMERRMSG));
      break;
    }
    case LUA_ERRERR: {
      setsvalue2s(L, oldtop, luaS_newliteral(L, "error in error handling"));
      break;
    }
    case LUA_ERRSYNTAX:
    case LUA_ERRRUN: {
      setobjs2s(L, oldtop, L->top - 1);  /* error message on current top */
      break;
    }
  }
  L->top = oldtop + 1;
}